

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
          (QPDFPageLabelDocumentHelper *this,QPDF *qpdf)

{
  bool bVar1;
  Members *__p;
  allocator<char> local_71;
  QPDFObjectHandle root;
  QPDFObjectHandle local_60;
  __shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  (this->super_QPDFDocumentHelper).qpdf = qpdf;
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFPageLabelDocumentHelper_002adbc8;
  __p = (Members *)operator_new(0x10);
  (__p->labels).super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->labels).super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<QPDFPageLabelDocumentHelper::Members,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFPageLabelDocumentHelper::Members,void>
            ((__shared_ptr<QPDFPageLabelDocumentHelper::Members,(__gnu_cxx::_Lock_policy)2> *)
             &this->m,__p);
  QPDF::getRoot((QPDF *)&root);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"/PageLabels",(allocator<char> *)&local_50);
  bVar1 = QPDFObjectHandle::hasKey(&root,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"/PageLabels",&local_71);
    QPDFObjectHandle::getKey(&local_60,(string *)&root);
    std::make_shared<QPDFNumberTreeObjectHelper,QPDFObjectHandle,QPDF&>
              ((QPDFObjectHandle *)&local_50,(QPDF *)&local_60);
    std::__shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2> *)
               (this->m).
               super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    QPDFObjectHandle root = qpdf.getRoot();
    if (root.hasKey("/PageLabels")) {
        m->labels =
            std::make_shared<QPDFNumberTreeObjectHelper>(root.getKey("/PageLabels"), this->qpdf);
    }
}